

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyConvertCDATANodes(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  
  while (node != (Node *)0x0) {
    if (node->type == CDATATag) {
      node->type = TextNode;
    }
    pNVar2 = node->next;
    ppNVar1 = &node->content;
    node = pNVar2;
    if (*ppNVar1 != (Node *)0x0) {
      prvTidyConvertCDATANodes(doc,*ppNVar1);
    }
  }
  return;
}

Assistant:

void TY_(ConvertCDATANodes)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CDATATag)
            node->type = TextNode;

        if (node->content)
            TY_(ConvertCDATANodes)(doc, node->content);

        node = next;
    }
}